

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gate.cpp
# Opt level: O0

void __thiscall tiles::Gate::alternativeTile(Gate *this,Chunk *chunk,uint tileIndex)

{
  TileData *pTVar1;
  TileData *tileData;
  Chunk *in_stack_ffffffffffffffd8;
  TileType *in_stack_ffffffffffffffe0;
  
  pTVar1 = TileType::modifyTileData(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  if (((uint)*pTVar1 & 0x1f) != 9) {
    if ((int)(((uint)*pTVar1 & 0x1f) - 10) % 2 == 0) {
      *pTVar1 = (TileData)((uint)*pTVar1 & 0xffffffe0 | ((uint)*pTVar1 & 0x1f) + 1 & 0x1f);
    }
    else {
      *pTVar1 = (TileData)((uint)*pTVar1 & 0xffffffe0 | ((uint)*pTVar1 & 0x1f) - 1 & 0x1f);
    }
  }
  return;
}

Assistant:

void Gate::alternativeTile(Chunk& chunk, unsigned int tileIndex) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id != TileId::gateDiode) {
        if ((tileData.id - TileId::gateBuffer) % 2 == 0) {
            tileData.id = static_cast<TileId::t>(tileData.id + 1);
        } else {
            tileData.id = static_cast<TileId::t>(tileData.id - 1);
        }
    }
}